

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockSpace(ImGuiID id,ImVec2 *size_arg,ImGuiDockNodeFlags flags,
                     ImGuiWindowClass *window_class)

{
  byte *pbVar1;
  ImGuiWindow *this;
  ImGuiWindow *pIVar2;
  ImVec2 IVar3;
  ImGuiContext *ctx;
  ImGuiContext *pIVar4;
  bool bVar5;
  ImGuiID IVar6;
  ImGuiContext *g_1;
  ImGuiDockNode *node;
  ImGuiContext *g;
  uint uVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  char title [256];
  
  ctx = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (((ctx->IO).ConfigFlags & 0x40) != 0) {
    uVar7 = (uint)this->SkipItems | flags;
    node = DockContextFindNodeByID(ctx,id);
    if (node == (ImGuiDockNode *)0x0) {
      node = DockContextAddNode(ctx,id);
      pbVar1 = (byte *)((long)&node->LocalFlags + 1);
      *pbVar1 = *pbVar1 | 8;
    }
    node->SharedFlags = uVar7;
    if (window_class == (ImGuiWindowClass *)0x0) {
      title[0] = '\0';
      title[1] = '\0';
      title[2] = '\0';
      title[3] = '\0';
      title[4] = '\0';
      title[5] = '\0';
      title[6] = '\0';
      title[7] = '\0';
      title[8] = '\0';
      title[9] = '\0';
      title[10] = '\0';
      title[0xb] = '\0';
      title[0xc] = '\0';
      title[0xd] = '\0';
      title[0xe] = '\0';
      title[0xf] = '\0';
      title[0x10] = '\0';
      bVar5 = true;
    }
    else {
      title[0x10] = window_class->DockingAlwaysTabBar;
      title._0_8_ = *(undefined8 *)window_class;
      title._8_8_ = *(undefined8 *)&window_class->ViewportFlagsOverrideSet;
      bVar5 = window_class->DockingAllowUnclassed;
    }
    (node->WindowClass).DockingAlwaysTabBar = (bool)title[0x10];
    *(undefined8 *)&node->WindowClass = title._0_8_;
    *(undefined8 *)&(node->WindowClass).ViewportFlagsOverrideSet = title._8_8_;
    (node->WindowClass).DockingAllowUnclassed = bVar5;
    iVar10 = ctx->FrameCount;
    node->LocalFlags = node->LocalFlags | 0x400;
    if ((node->LastFrameActive != iVar10) || ((uVar7 & 1) != 0)) {
      if ((uVar7 & 1) == 0) {
        IVar3 = GetContentRegionAvail();
        iVar10 = (int)(*size_arg).x;
        fVar8 = (float)iVar10;
        fVar9 = (float)(int)(*size_arg).y;
        if ((iVar10 < 1) && (fVar8 = IVar3.x + fVar8, fVar8 <= 4.0)) {
          fVar8 = 4.0;
        }
        if ((fVar9 <= 0.0) && (fVar9 = IVar3.y + fVar9, fVar9 <= 4.0)) {
          fVar9 = 4.0;
        }
        node->Pos = (this->DC).CursorPos;
        (node->Size).x = fVar8;
        (node->Size).y = fVar9;
        (node->SizeRef).x = fVar8;
        (node->SizeRef).y = fVar9;
        pIVar4 = GImGui;
        uVar7 = (GImGui->NextWindowData).Flags;
        (GImGui->NextWindowData).Flags = uVar7 | 1;
        (pIVar4->NextWindowData).PosVal = node->Pos;
        (pIVar4->NextWindowData).PosPivotVal.x = 0.0;
        (pIVar4->NextWindowData).PosPivotVal.y = 0.0;
        (pIVar4->NextWindowData).PosCond = 1;
        (pIVar4->NextWindowData).PosUndock = true;
        (pIVar4->NextWindowData).Flags = uVar7 | 3;
        (pIVar4->NextWindowData).SizeVal = node->Size;
        (pIVar4->NextWindowData).SizeCond = 1;
        (ctx->NextWindowData).PosUndock = false;
        ImFormatString(title,0x100,"%s/DockSpace_%08X",this->Name,(ulong)id);
        if ((0 < (node->Windows).Size) || (node->ChildNodes[0] != (ImGuiDockNode *)0x0)) {
          PushStyleColor(3,0);
        }
        PushStyleVar(7,0.0);
        Begin(title,(bool *)0x0,0x2100013b);
        PopStyleVar(1);
        if ((0 < (node->Windows).Size) || (node->ChildNodes[0] != (ImGuiDockNode *)0x0)) {
          PopStyleColor(1);
        }
        pIVar2 = ctx->CurrentWindow;
        pIVar2->DockNodeAsHost = node;
        IVar6 = ImGuiWindow::GetID(this,title,(char *)0x0);
        pIVar2->ChildId = IVar6;
        node->HostWindow = pIVar2;
        node->OnlyNodeWithWindows = (ImGuiDockNode *)0x0;
        DockNodeUpdate(node);
        ctx->WithinEndChild = true;
        End();
        ctx->WithinEndChild = false;
      }
      else {
        node->LastFrameAlive = iVar10;
      }
    }
  }
  return;
}

Assistant:

void ImGui::DockSpace(ImGuiID id, const ImVec2& size_arg, ImGuiDockNodeFlags flags, const ImGuiWindowClass* window_class)
{
    ImGuiContext* ctx = GImGui;
    ImGuiContext& g = *ctx;
    ImGuiWindow* window = GetCurrentWindow();
    if (!(g.IO.ConfigFlags & ImGuiConfigFlags_DockingEnable))
        return;

    // Early out if parent window is hidden/collapsed
    // This is faster but also DockNodeUpdateTabBar() relies on TabBarLayout() running (which won't if SkipItems=true) to set NextSelectedTabId = 0). See #2960.
    // If for whichever reason this is causing problem we would need to ensure that DockNodeUpdateTabBar() ends up clearing NextSelectedTabId even if SkipItems=true.
    if (window->SkipItems)
        flags |= ImGuiDockNodeFlags_KeepAliveOnly;

    IM_ASSERT((flags & ImGuiDockNodeFlags_DockSpace) == 0);
    ImGuiDockNode* node = DockContextFindNodeByID(ctx, id);
    if (!node)
    {
        IMGUI_DEBUG_LOG_DOCKING("DockSpace: dockspace node 0x%08X created\n", id);
        node = DockContextAddNode(ctx, id);
        node->LocalFlags |= ImGuiDockNodeFlags_CentralNode;
    }
    if (window_class && window_class->ClassId != node->WindowClass.ClassId)
        IMGUI_DEBUG_LOG_DOCKING("DockSpace: dockspace node 0x%08X: setup WindowClass 0x%08X -> 0x%08X\n", id, node->WindowClass.ClassId, window_class->ClassId);
    node->SharedFlags = flags;
    node->WindowClass = window_class ? *window_class : ImGuiWindowClass();

    // When a DockSpace transitioned form implicit to explicit this may be called a second time
    // It is possible that the node has already been claimed by a docked window which appeared before the DockSpace() node, so we overwrite IsDockSpace again.
    if (node->LastFrameActive == g.FrameCount && !(flags & ImGuiDockNodeFlags_KeepAliveOnly))
    {
        IM_ASSERT(node->IsDockSpace() == false && "Cannot call DockSpace() twice a frame with the same ID");
        node->LocalFlags |= ImGuiDockNodeFlags_DockSpace;
        return;
    }
    node->LocalFlags |= ImGuiDockNodeFlags_DockSpace;

    // Keep alive mode, this is allow windows docked into this node so stay docked even if they are not visible
    if (flags & ImGuiDockNodeFlags_KeepAliveOnly)
    {
        node->LastFrameAlive = g.FrameCount;
        return;
    }

    const ImVec2 content_avail = GetContentRegionAvail();
    ImVec2 size = ImFloor(size_arg);
    if (size.x <= 0.0f)
        size.x = ImMax(content_avail.x + size.x, 4.0f); // Arbitrary minimum child size (0.0f causing too much issues)
    if (size.y <= 0.0f)
        size.y = ImMax(content_avail.y + size.y, 4.0f);
    IM_ASSERT(size.x > 0.0f && size.y > 0.0f);

    node->Pos = window->DC.CursorPos;
    node->Size = node->SizeRef = size;
    SetNextWindowPos(node->Pos);
    SetNextWindowSize(node->Size);
    g.NextWindowData.PosUndock = false;

    // FIXME-DOCK Why do we need a child window to host a dockspace, could we host it in the existing window?
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_DockNodeHost;
    window_flags |= ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoCollapse | ImGuiWindowFlags_NoTitleBar;
    window_flags |= ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoScrollWithMouse;

    char title[256];
    ImFormatString(title, IM_ARRAYSIZE(title), "%s/DockSpace_%08X", window->Name, id);

    if (node->Windows.Size > 0 || node->IsSplitNode())
        PushStyleColor(ImGuiCol_ChildBg, IM_COL32(0, 0, 0, 0));
    PushStyleVar(ImGuiStyleVar_ChildBorderSize, 0.0f);
    Begin(title, NULL, window_flags);
    PopStyleVar();
    if (node->Windows.Size > 0 || node->IsSplitNode())
        PopStyleColor();

    ImGuiWindow* host_window = g.CurrentWindow;
    host_window->DockNodeAsHost = node;
    host_window->ChildId = window->GetID(title);
    node->HostWindow = host_window;
    node->OnlyNodeWithWindows = NULL;

    IM_ASSERT(node->IsRootNode());
    DockNodeUpdate(node);

    g.WithinEndChild = true;
    End();
    g.WithinEndChild = false;
}